

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_text(LodePNGInfo *info,char *key,char *str)

{
  char **ptr;
  char **ptr_00;
  char **new_strings;
  char **new_keys;
  char *str_local;
  char *key_local;
  LodePNGInfo *info_local;
  
  ptr = (char **)lodepng_realloc(info->text_keys,(info->text_num + 1) * 8);
  ptr_00 = (char **)lodepng_realloc(info->text_strings,(info->text_num + 1) * 8);
  if ((ptr == (char **)0x0) || (ptr_00 == (char **)0x0)) {
    lodepng_free(ptr);
    lodepng_free(ptr_00);
    info_local._4_4_ = 0x53;
  }
  else {
    info->text_num = info->text_num + 1;
    info->text_keys = ptr;
    info->text_strings = ptr_00;
    string_init(info->text_keys + (info->text_num - 1));
    string_set(info->text_keys + (info->text_num - 1),key);
    string_init(info->text_strings + (info->text_num - 1));
    string_set(info->text_strings + (info->text_num - 1),str);
    info_local._4_4_ = 0;
  }
  return info_local._4_4_;
}

Assistant:

unsigned lodepng_add_text(LodePNGInfo* info, const char* key, const char* str)
{
  char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));
  if(!new_keys || !new_strings)
  {
    lodepng_free(new_keys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->text_num;
  info->text_keys = new_keys;
  info->text_strings = new_strings;

  string_init(&info->text_keys[info->text_num - 1]);
  string_set(&info->text_keys[info->text_num - 1], key);

  string_init(&info->text_strings[info->text_num - 1]);
  string_set(&info->text_strings[info->text_num - 1], str);

  return 0;
}